

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexer.cxx
# Opt level: O0

void cmCTestResourceGroups_yy_init_buffer(YY_BUFFER_STATE b,FILE *file,yyscan_t yyscanner)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint local_44;
  YY_BUFFER_STATE local_40;
  yyguts_t *yyg;
  int oerrno;
  yyscan_t yyscanner_local;
  FILE *file_local;
  YY_BUFFER_STATE b_local;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  cmCTestResourceGroups_yy_flush_buffer(b,yyscanner);
  b->yy_input_file = file;
  b->yy_fill_buffer = 1;
  if (*(long *)((long)yyscanner + 0x28) == 0) {
    local_40 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_40 = *(YY_BUFFER_STATE *)
                (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  }
  if (b != local_40) {
    b->yy_bs_lineno = 1;
    b->yy_bs_column = 0;
  }
  if (file == (FILE *)0x0) {
    local_44 = 0;
  }
  else {
    iVar2 = fileno((FILE *)file);
    iVar2 = isatty(iVar2);
    local_44 = (uint)(0 < iVar2);
  }
  b->yy_is_interactive = local_44;
  piVar3 = __errno_location();
  *piVar3 = iVar1;
  return;
}

Assistant:

static void yy_init_buffer  (YY_BUFFER_STATE  b, FILE * file , yyscan_t yyscanner)

{
	int oerrno = errno;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	yy_flush_buffer( b , yyscanner);

	b->yy_input_file = file;
	b->yy_fill_buffer = 1;

    /* If b is the current buffer, then yy_init_buffer was _probably_
     * called from yyrestart() or through yy_get_next_buffer.
     * In that case, we don't want to reset the lineno or column.
     */
    if (b != YY_CURRENT_BUFFER){
        b->yy_bs_lineno = 1;
        b->yy_bs_column = 0;
    }

        b->yy_is_interactive = file ? (isatty( fileno(file) ) > 0) : 0;

	errno = oerrno;
}